

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::gettetrahedron(tetgenmesh *this,point pa,point pb,point pc,point pd,triface *searchtet)

{
  int iVar1;
  point pdVar2;
  undefined1 auStack_50 [4];
  int t1ver;
  triface spintet;
  triface *searchtet_local;
  point pd_local;
  point pc_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  spintet._8_8_ = searchtet;
  triface::triface((triface *)auStack_50);
  iVar1 = getedge(this,pa,pb,(triface *)spintet._8_8_);
  if (iVar1 != 0) {
    triface::operator=((triface *)auStack_50,(triface *)spintet._8_8_);
    do {
      pdVar2 = apex(this,(triface *)auStack_50);
      iVar1 = (int)spintet.tet;
      if (pdVar2 == pc) {
        triface::operator=((triface *)spintet._8_8_,(triface *)auStack_50);
        break;
      }
      decode(this,_auStack_50[facepivot1[(int)spintet.tet]],(triface *)auStack_50);
      spintet.tet._0_4_ = facepivot2[iVar1][(int)spintet.tet];
    } while (_auStack_50 != *(tetrahedron **)spintet._8_8_);
    pdVar2 = apex(this,(triface *)spintet._8_8_);
    if (pdVar2 == pc) {
      pdVar2 = oppo(this,(triface *)spintet._8_8_);
      if (pdVar2 == pd) {
        return 1;
      }
      iVar1 = *(int *)(spintet._8_8_ + 8);
      decode(this,*(tetrahedron *)
                   (*(long *)spintet._8_8_ + (long)(int)(*(uint *)(spintet._8_8_ + 8) & 3) * 8),
             (triface *)spintet._8_8_);
      *(int *)(spintet._8_8_ + 8) = fsymtbl[iVar1][*(int *)(spintet._8_8_ + 8)];
      pdVar2 = oppo(this,(triface *)spintet._8_8_);
      if (pdVar2 == pd) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::gettetrahedron(point pa, point pb, point pc, point pd, 
                               triface *searchtet)
{
  triface spintet;
  int t1ver; 

  if (getedge(pa, pb, searchtet)) {
    spintet = *searchtet;
    while (1) {
      if (apex(spintet) == pc) {
        *searchtet = spintet;
        break;
      }
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    }
    if (apex(*searchtet) == pc) {
      if (oppo(*searchtet) == pd) {
        return 1;
      } else {
        fsymself(*searchtet);
        if (oppo(*searchtet) == pd) {
          return 1;
        }
      }
    }
  }

  return 0;
}